

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mips.cpp
# Opt level: O3

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> __thiscall
CMipsArchitecture::parseOpcode(CMipsArchitecture *this,Parser *parser)

{
  MipsParser mipsParser;
  _func_int **local_400;
  _Alloc_hider local_3f8;
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [40];
  undefined1 local_3b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8 [2];
  undefined1 local_388 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_378 [2];
  undefined1 local_358 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_348 [2];
  undefined1 local_328 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318 [2];
  undefined1 local_2f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8 [2];
  undefined1 local_2c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8 [2];
  undefined1 local_298 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288 [2];
  undefined1 local_268 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258 [2];
  undefined1 local_238 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228 [2];
  undefined1 local_208 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8 [2];
  undefined1 local_1d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8 [2];
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [2];
  undefined1 local_178 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168 [2];
  undefined1 local_148 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138 [2];
  undefined1 local_118 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108 [2];
  undefined1 local_e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8 [2];
  undefined1 local_b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_80;
  undefined1 local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_58;
  undefined1 local_50;
  
  local_3f0._8_8_ = local_3e0 + 8;
  local_3e0._8_8_ = 0;
  local_3e0._16_8_ = 0;
  local_3e0._0_8_ = 0;
  local_3b8._0_8_ = local_3a8;
  local_3a8[0]._0_8_ = 0;
  local_3a8[0]._8_8_ = 0;
  local_3b8._8_8_ = 0;
  local_388._0_8_ = local_378;
  local_378[0]._0_8_ = 0;
  local_378[0]._8_8_ = 0;
  local_388._8_8_ = 0;
  local_358._0_8_ = local_348;
  local_348[0]._0_8_ = 0;
  local_348[0]._8_8_ = 0;
  local_358._8_8_ = 0;
  local_328._0_8_ = local_318;
  local_318[0]._0_8_ = 0;
  local_318[0]._8_8_ = 0;
  local_328._8_8_ = 0;
  local_2f8._0_8_ = local_2e8;
  local_2e8[0]._0_8_ = 0;
  local_2e8[0]._8_8_ = 0;
  local_2f8._8_8_ = 0;
  local_2c8._0_8_ = local_2b8;
  local_2b8[0]._0_8_ = 0;
  local_2b8[0]._8_8_ = 0;
  local_2c8._8_8_ = 0;
  local_298._0_8_ = local_288;
  local_288[0]._0_8_ = 0;
  local_288[0]._8_8_ = 0;
  local_298._8_8_ = 0;
  local_268._0_8_ = local_258;
  local_258[0]._0_8_ = 0;
  local_258[0]._8_8_ = 0;
  local_268._8_8_ = 0;
  local_238._0_8_ = local_228;
  local_228[0]._0_8_ = 0;
  local_228[0]._8_8_ = 0;
  local_238._8_8_ = 0;
  local_208._0_8_ = local_1f8;
  local_1f8[0]._0_8_ = 0;
  local_1f8[0]._8_8_ = 0;
  local_208._8_8_ = 0;
  local_1d8._0_8_ = local_1c8;
  local_1c8[0]._0_8_ = 0;
  local_1c8[0]._8_8_ = 0;
  local_1d8._8_8_ = 0;
  local_1a8._0_8_ = local_198;
  local_198[0]._0_8_ = 0;
  local_198[0]._8_8_ = 0;
  local_1a8._8_8_ = 0;
  local_178._0_8_ = local_168;
  local_168[0]._0_8_ = 0;
  local_168[0]._8_8_ = 0;
  local_178._8_8_ = 0;
  local_148._0_8_ = local_138;
  local_138[0]._0_8_ = 0;
  local_138[0]._8_8_ = 0;
  local_148._8_8_ = 0;
  local_118._0_8_ = local_108;
  local_108[0]._0_8_ = 0;
  local_108[0]._8_8_ = 0;
  local_118._8_8_ = 0;
  local_e8._0_8_ = local_d8;
  local_d8[0]._0_8_ = 0;
  local_d8[0]._8_8_ = 0;
  local_e8._8_8_ = 0;
  local_b8._0_8_ = local_a8;
  local_a8[0]._0_8_ = 0;
  local_a8[0]._8_8_ = 0;
  local_b8._8_8_ = 0;
  local_88._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_78 = Immediate5;
  local_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Stack_58 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_50 = 1;
  MipsParser::parseMacro((MipsParser *)&local_400,(Parser *)local_3f0);
  if (local_400 == (_func_int **)0x0) {
    MipsParser::parseOpcode((MipsParser *)&local_3f8,(Parser *)local_3f0);
    (this->super_Architecture)._vptr_Architecture = (_func_int **)local_3f8._M_p;
    if (local_400 != (_func_int **)0x0) {
      (**(code **)(*local_400 + 8))();
    }
  }
  else {
    (this->super_Architecture)._vptr_Architecture = local_400;
  }
  if (p_Stack_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_58);
  }
  if (p_Stack_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_80);
  }
  MipsRegisterData::~MipsRegisterData((MipsRegisterData *)local_3f0);
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<CAssemblerCommand> CMipsArchitecture::parseOpcode(Parser& parser)
{
	MipsParser mipsParser;

	std::unique_ptr<CAssemblerCommand> macro = mipsParser.parseMacro(parser);
	if (macro != nullptr)
		return macro;

	return mipsParser.parseOpcode(parser);
}